

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void jx9VmRandomString(jx9_vm *pVm,char *zBuf,int nLen)

{
  ulong uVar1;
  ulong uVar2;
  
  SyRandomness(&pVm->sPrng,zBuf,nLen);
  uVar1 = 0;
  uVar2 = (ulong)(uint)nLen;
  if (nLen < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    zBuf[uVar1] = "abcdefghijklmnopqrstuvwxyz"[(ulong)(long)zBuf[uVar1] % 0x1a];
  }
  return;
}

Assistant:

JX9_PRIVATE void jx9VmRandomString(jx9_vm *pVm, char *zBuf, int nLen)
{
	static const char zBase[] = {"abcdefghijklmnopqrstuvwxyz"}; /* English Alphabet */
	int i;
	/* Generate a binary string first */
	SyRandomness(&pVm->sPrng, zBuf, (sxu32)nLen);
	/* Turn the binary string into english based alphabet */
	for( i = 0 ; i < nLen ; ++i ){
		 zBuf[i] = zBase[zBuf[i] % (sizeof(zBase)-1)];
	 }
}